

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

void * memleak_alloc(size_t size,char *file,size_t line)

{
  void *pvVar1;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  void *unaff_retaddr;
  void *addr;
  
  pvVar1 = malloc(in_RDI);
  if ((pvVar1 != (void *)0x0) && (start_sw != '\0')) {
    pthread_spin_lock(&lock);
    _memleak_add_to_index(unaff_retaddr,in_RDI,in_RSI,in_RDX,(uint8_t)((ulong)pvVar1 >> 0x38));
    pthread_spin_unlock(&lock);
  }
  return pvVar1;
}

Assistant:

LIBMEMLEAK_API
void * memleak_alloc(size_t size, char *file, size_t line)
{
    void *addr = (void*)malloc(size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, INIT_VAL);
        spin_unlock(&lock);
    }

    return addr;
}